

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleComputeInstance::writeImageSamplerDescriptorSet
          (ImageSampleComputeInstance *this,VkDescriptorSet descriptorSet)

{
  DescriptorSetUpdateBuilder *this_00;
  ShaderInputInterface SVar1;
  undefined1 *__buf;
  int __fd;
  VkDescriptorImageInfo imageSamplers [2];
  VkDescriptorBufferInfo resultInfo;
  
  this_00 = &this->m_updateBuilder;
  __fd = (int)descriptorSet.m_internal;
  ::vk::DescriptorSetUpdateBuilder::write(this_00,__fd,(void *)0x0,0);
  SVar1 = this->m_shaderInterface;
  if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    __buf = &DAT_00000001;
  }
  else if (SVar1 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    ::vk::DescriptorSetUpdateBuilder::write(this_00,__fd,&DAT_00000001,0);
    __buf = (undefined1 *)0x2;
  }
  else {
    if (SVar1 != SHADER_INPUT_SINGLE_DESCRIPTOR) goto LAB_00512e90;
    __buf = &DAT_00000001;
  }
  ::vk::DescriptorSetUpdateBuilder::write(this_00,__fd,__buf,0);
LAB_00512e90:
  if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
    ::vk::DescriptorSetUpdateBuilder::update(this_00,this->m_vki,this->m_device);
  }
  return;
}

Assistant:

void ImageSampleComputeInstance::writeImageSamplerDescriptorSet (vk::VkDescriptorSet descriptorSet)
{
	const vk::VkDescriptorBufferInfo	resultInfo			= vk::makeDescriptorBufferInfo(m_result.getBuffer(), 0u, (vk::VkDeviceSize)ComputeInstanceResultBuffer::DATA_SIZE);
	const vk::VkSampler					samplers[2]			=
	{
		(m_isImmutableSampler && (m_updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)) ? (0) : (m_images.getSamplerA()),
		(m_isImmutableSampler && (m_updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)) ? (0) : (m_images.getSamplerB()),
	};
	const vk::VkDescriptorImageInfo		imageSamplers[2]	=
	{
		makeDescriptorImageInfo(samplers[0], m_images.getImageViewA(), vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
		makeDescriptorImageInfo(samplers[1], m_images.getImageViewB(), vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
	};

	// result
	m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(0u), vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultInfo);

	// combined image samplers
	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, &imageSamplers[0]);
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, &imageSamplers[0]);
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(2u), vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, &imageSamplers[1]);
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			m_updateBuilder.writeArray(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, 2u, imageSamplers);
			break;

		default:
			DE_FATAL("Impossible");
	}

	if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL)
	{
		m_updateBuilder.update(m_vki, m_device);
	}
}